

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O2

char * seekNewline(char *s,size_t len)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  iVar1 = (int)len + -1;
  iVar2 = 0;
  while( true ) {
    if (iVar1 <= iVar2) {
      return (char *)0x0;
    }
    lVar5 = (long)iVar2;
    lVar3 = lVar5 << 0x20;
    lVar4 = 0;
    while( true ) {
      if (iVar1 - lVar5 == lVar4) {
        return (char *)0x0;
      }
      if (s[lVar4 + lVar5] == '\r') break;
      lVar3 = lVar3 + 0x100000000;
      lVar4 = lVar4 + 1;
    }
    if (iVar1 - iVar2 == (int)lVar4) break;
    iVar2 = iVar2 + (int)lVar4 + 1;
    if (s[iVar2] == '\n') {
      return s + (lVar3 >> 0x20);
    }
  }
  return (char *)0x0;
}

Assistant:

static char *seekNewline(char *s, size_t len) {
    int pos = 0;
    int _len = len-1;

    /* Position should be < len-1 because the character at "pos" should be
     * followed by a \n. Note that strchr cannot be used because it doesn't
     * allow to search a limited length and the buffer that is being searched
     * might not have a trailing NULL character. */
    while (pos < _len) {
        while(pos < _len && s[pos] != '\r') pos++;
        if (pos==_len) {
            /* Not found. */
            return NULL;
        } else {
            if (s[pos+1] == '\n') {
                /* Found. */
                return s+pos;
            } else {
                /* Continue searching. */
                pos++;
            }
        }
    }
    return NULL;
}